

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O2

Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
* __thiscall
Corrade::Containers::BasicStringView<const_char>::split
          (Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
           *__return_storage_ptr__,BasicStringView<const_char> *this,StringView delimiter)

{
  char *end;
  ostream *output;
  char *pcVar1;
  char *data;
  ulong substringSize;
  BasicStringView<const_char> local_58;
  
  substringSize = delimiter._sizePlusFlags & 0x3fffffffffffffff;
  if (((undefined1  [16])delimiter & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0)
  {
    output = Utility::Error::defaultOutput();
    Utility::Error::Error((Error *)&local_58,output,(Flags)0x0);
    Utility::Debug::operator<<
              ((Debug *)&local_58,"Containers::StringView::split(): delimiter is empty");
    Utility::Error::~Error((Error *)&local_58);
    abort();
  }
  __return_storage_ptr__->_data = (BasicStringView<const_char> *)0x0;
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_deleter = (_func_void_BasicStringView<const_char>_ptr_unsigned_long *)0x0
  ;
  data = this->_data;
  pcVar1 = data + (this->_sizePlusFlags & 0x3fffffffffffffff);
  while (data < pcVar1) {
    end = Implementation::stringFindString
                    (data,(long)pcVar1 - (long)data,delimiter._data,substringSize);
    if (end == (char *)0x0) break;
    local_58 = slice(this,data,end);
    arrayAppend<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char_const>>>
              (__return_storage_ptr__,&local_58);
    data = end + substringSize;
  }
  if ((this->_sizePlusFlags & 0x3fffffffffffffff) != 0) {
    local_58 = suffix(this,data);
    arrayAppend<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char_const>>>
              (__return_storage_ptr__,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<BasicStringView<T>> BasicStringView<T>::split(const StringView delimiter) const {
    const char* const delimiterData = delimiter.data();
    const std::size_t delimiterSize = delimiter.size();
    CORRADE_ASSERT(delimiterSize, "Containers::StringView::split(): delimiter is empty", {});

    Array<BasicStringView<T>> parts;
    const char* const end = this->end();
    const char* oldpos = _data;
    const char* pos;
    while(oldpos < end && (pos = Implementation::stringFindString(oldpos, end - oldpos, delimiterData, delimiterSize))) {
        arrayAppend(parts, slice(const_cast<T*>(oldpos), const_cast<T*>(pos)));
        oldpos = pos + delimiterSize;
    }

    if(!isEmpty())
        arrayAppend(parts, suffix(const_cast<T*>(oldpos)));

    return parts;
}